

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<mp::var::Type>>,std::tuple<int,mp::var::Type>>
               (tuple<testing::Matcher<int>,_testing::Matcher<mp::var::Type>_> *matchers,
               tuple<int,_mp::var::Type> *values,ostream *os)

{
  bool bVar1;
  StringMatchResultListener *this;
  ostream *in_RDX;
  tuple<testing::Matcher<int>,_testing::Matcher<mp::var::Type>_> *in_RSI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  Matcher<mp::var::Type> *in_stack_fffffffffffffde8;
  Type x;
  StringMatchResultListener *in_stack_fffffffffffffdf0;
  string local_200 [16];
  StringMatchResultListener *in_stack_fffffffffffffe10;
  ostream *in_stack_ffffffffffffffe0;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<mp::var::Type>>,std::tuple<int,mp::var::Type>>
            (in_RSI,(tuple<int,_mp::var::Type> *)in_RDX,in_stack_ffffffffffffffe0);
  std::get<1ul,testing::Matcher<int>,testing::Matcher<mp::var::Type>>
            ((tuple<testing::Matcher<int>,_testing::Matcher<mp::var::Type>_> *)0x1902d9);
  Matcher<mp::var::Type>::Matcher
            ((Matcher<mp::var::Type> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  x = (Type)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  std::get<1ul,int,mp::var::Type>((tuple<int,_mp::var::Type> *)0x1902f6);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe10);
  bVar1 = MatcherBase<mp::var::Type>::MatchAndExplain
                    ((MatcherBase<mp::var::Type> *)in_stack_fffffffffffffdf0,x,
                     (MatchResultListener *)0x190324);
  if (!bVar1) {
    in_stack_fffffffffffffdf0 =
         (StringMatchResultListener *)std::operator<<(in_RDX,"  Expected arg #");
    this = (StringMatchResultListener *)std::ostream::operator<<(in_stack_fffffffffffffdf0,1);
    std::operator<<((ostream *)this,": ");
    std::get<1ul,testing::Matcher<int>,testing::Matcher<mp::var::Type>>
              ((tuple<testing::Matcher<int>,_testing::Matcher<mp::var::Type>_> *)0x190387);
    MatcherBase<mp::var::Type>::DescribeTo
              ((MatcherBase<mp::var::Type> *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::operator<<(in_RDX,"\n           Actual: ");
    UniversalPrint<mp::var::Type>((Type *)in_stack_fffffffffffffdf0,(ostream *)this);
    StringMatchResultListener::str_abi_cxx11_(this);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::__cxx11::string::~string(local_200);
    std::operator<<(in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdf0);
  Matcher<mp::var::Type>::~Matcher((Matcher<mp::var::Type> *)0x19045e);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }